

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O2

string * getTargetLanguageCode(string *__return_storage_ptr__,Parser *PhParser,string *TgtLang)

{
  char *__s1;
  int iVar1;
  ostream *poVar2;
  allocator local_3c9;
  string local_3c8;
  OMPCG OMP;
  Sema S;
  GraphCodeGen Gen;
  
  phaeton::Sema::Sema(&S);
  phaeton::ASTVisitor::visitProgram(&S.super_ASTVisitor,PhParser->AST);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&Gen);
  __s1 = (TgtLang->_M_dataplus)._M_p;
  iVar1 = strcmp(__s1,"OPENMP");
  if (iVar1 != 0) {
    iVar1 = strcmp(__s1,"NUMPY");
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
      std::operator<<(poVar2,"Target language not support yet\n");
    }
    else {
      iVar1 = strcmp(__s1,"OPENCL");
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
        std::operator<<(poVar2,"Target language not support yet\n");
      }
      else {
        iVar1 = strcmp(__s1,"CUDA");
        if (iVar1 == 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
          std::operator<<(poVar2,"Target language not support yet\n");
        }
        else {
          iVar1 = strcmp(__s1,"BANG");
          if (iVar1 == 0) {
            poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
            poVar2 = std::operator<<(poVar2,":");
            poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
            std::operator<<(poVar2,"Target language not support yet\n");
          }
          else {
            iVar1 = strcmp(__s1,"CCE");
            if (iVar1 == 0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
              std::operator<<(poVar2,"Target language not support yet\n");
            }
            else {
              iVar1 = strcmp(__s1,"TPU");
              if (iVar1 != 0) goto LAB_0010d2db;
              poVar2 = std::operator<<((ostream *)&std::cout,"ph-opt");
              poVar2 = std::operator<<(poVar2,":");
              poVar2 = std::operator<<(poVar2,"\x1b[31m wip: \x1b[0m");
              std::operator<<(poVar2,"Target language not support yet\n");
            }
          }
        }
      }
    }
    exit(0);
  }
  std::__cxx11::string::string((string *)&OMP,"omp_func",&local_3c9);
  phaeton::GraphCodeGen::GraphCodeGen(&Gen,&S,(string *)&OMP);
  std::__cxx11::string::~string((string *)&OMP);
  std::__cxx11::string::string((string *)&local_3c8,"float",&local_3c9);
  phaeton::OMPCG::OMPCG(&OMP,&Gen.super_CodeGen,true,false,false,false,false,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  phaeton::OMPCG::genCode(&OMP,PhParser->AST);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  phaeton::OMPCG::~OMPCG(&OMP);
  phaeton::GraphCodeGen::~GraphCodeGen(&Gen);
LAB_0010d2db:
  phaeton::Sema::~Sema(&S);
  return __return_storage_ptr__;
}

Assistant:

std::string getTargetLanguageCode(const Parser &PhParser,
                                  const std::string &TgtLang) {
  Sema S;
  S.visitProgram(PhParser.getAST());
  std::string TgtCode = "";
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    GraphCodeGen Gen(&S, "omp_func");
    // FIXME: CodeGen mode must be sync with a specific codegen, i.e.
    // if we omit the function name, the wrapper caller will be wrong.
    OMPCG OMP(&Gen, true);
    OMP.genCode(PhParser.getAST());
    TgtCode = OMP.getCode();
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    std::cout << PH_OPTIMIZER_EXE << ":" << FRED(" wip: ")
              << "Target language not support yet\n";
    exit(EXIT_SUCCESS);
  }
  return TgtCode;
}